

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

int stb__wildmatch_raw2(char *expr,char *candidate,int search,int insensitive)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  __int32_t **pp_Var8;
  char cVar9;
  long lVar10;
  char cVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  char *pcVar15;
  char *qstring;
  
  if (search == 0) {
    uVar13 = -(uint)(*expr == '*');
    lVar10 = 0;
    do {
      bVar2 = expr[lVar10];
      uVar6 = (uint)bVar2;
      if (bVar2 == 0x3f) {
        if (candidate[lVar10] == '\0') {
          return -1;
        }
      }
      else {
        if (bVar2 == 0x2a) {
          candidate = candidate + lVar10;
          expr = expr + lVar10;
          goto LAB_0018b619;
        }
        if (bVar2 == 0) {
          return -(uint)(candidate[lVar10] != '\0');
        }
        if (insensitive == 0) {
          if (candidate[lVar10] != bVar2) {
            return -1;
          }
        }
        else {
          pp_Var8 = __ctype_tolower_loc();
          if ((*pp_Var8)[candidate[lVar10]] != (*pp_Var8)[(char)bVar2]) {
            return -1;
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while( true );
  }
  uVar13 = 0xffffffff;
  lVar10 = 0;
  uVar6 = 0;
  if (*expr == '\0') {
    return 0;
  }
LAB_0018b619:
  if ((search == 0) && (*expr != '*')) {
    __assert_fail("search || *expr == \'*\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0x22f2,"int stb__wildmatch_raw2(char *, char *, int, int)");
  }
  qstring = expr + (search == 0);
LAB_0018b637:
  if (*qstring == '\0') {
    if ((int)uVar13 < 1) {
      return 0;
    }
    return uVar13;
  }
  for (; *qstring == '*'; qstring = qstring + 1) {
  }
  if (*qstring != '\0') {
    for (lVar14 = 0; (cVar11 = qstring[lVar14], cVar11 != '\0' && (cVar11 != '*'));
        lVar14 = lVar14 + 1) {
    }
    iVar4 = (int)lVar14;
    if ((search == 0) && (cVar11 == '\0')) {
      if (lVar14 != 0) {
        lVar7 = 0;
        do {
          if (candidate[lVar7] == '\0') {
            uVar6 = 0xffffffff;
            goto LAB_0018b811;
          }
          lVar7 = lVar7 + 1;
        } while (lVar14 != lVar7);
      }
      pcVar15 = candidate + -1;
      do {
        pcVar1 = pcVar15 + lVar14 + 1;
        pcVar15 = pcVar15 + 1;
      } while (*pcVar1 != '\0');
      iVar4 = stb__match_qstring(pcVar15,qstring,iVar4,insensitive);
      bVar3 = false;
      if (iVar4 != 0) goto LAB_0018b655;
      uVar6 = 0xffffffff;
      goto LAB_0018b81a;
    }
    lVar7 = 0;
    pcVar15 = candidate + 1;
    do {
      cVar11 = qstring[lVar7];
      if ((long)cVar11 != 0x3f) {
        if (insensitive != 0) {
          pp_Var8 = __ctype_tolower_loc();
          cVar11 = (char)(*pp_Var8)[cVar11];
        }
        cVar9 = candidate[lVar7];
        iVar12 = -1;
        if (cVar9 == '\0') goto LAB_0018b7bb;
        iVar12 = 0;
        goto LAB_0018b757;
      }
      if (iVar4 - 1U == (uint)lVar7) {
        iVar12 = 0;
        goto LAB_0018b7bb;
      }
      pcVar15 = pcVar15 + 1;
      pcVar1 = candidate + 1 + lVar7;
      lVar7 = lVar7 + 1;
    } while (*pcVar1 != '\0');
    goto LAB_0018b7a1;
  }
LAB_0018b655:
  bVar3 = false;
  uVar6 = 0;
  if (0 < (int)uVar13) {
    uVar6 = uVar13;
  }
  goto LAB_0018b81a;
  while( true ) {
    cVar9 = *pcVar15;
    pcVar15 = pcVar15 + 1;
    iVar12 = iVar12 + 1;
    if (cVar9 == '\0') break;
LAB_0018b757:
    if (insensitive == 0) {
      iVar5 = (int)cVar9;
    }
    else {
      pp_Var8 = __ctype_tolower_loc();
      iVar5 = (*pp_Var8)[cVar9];
    }
    if ((iVar5 == cVar11) &&
       (iVar5 = stb__match_qstring(pcVar15,qstring + lVar7 + 1,~(uint)lVar7 + iVar4,insensitive),
       iVar5 != 0)) goto LAB_0018b7bb;
  }
LAB_0018b7a1:
  iVar12 = -1;
LAB_0018b7bb:
  if (iVar12 < 0) {
    uVar6 = 0xffffffff;
  }
  else {
    if ((int)uVar13 < 0) {
      uVar13 = iVar12 + (int)lVar10;
    }
    candidate = candidate + (uint)(iVar4 + iVar12);
    qstring = qstring + lVar14;
  }
  if (iVar12 < 0) {
LAB_0018b811:
    bVar3 = false;
  }
  else if (*qstring == '*') {
    qstring = qstring + 1;
    bVar3 = true;
  }
  else {
    if (*qstring != '\0') {
      __assert_fail("*expr == \'*\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0x2325,"int stb__wildmatch_raw2(char *, char *, int, int)");
    }
    if (search == 0) {
      __assert_fail("search",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0x2321,"int stb__wildmatch_raw2(char *, char *, int, int)");
    }
    bVar3 = false;
    uVar6 = uVar13;
  }
LAB_0018b81a:
  if (!bVar3) {
    return uVar6;
  }
  goto LAB_0018b637;
}

Assistant:

int stb__wildmatch_raw2(char *expr, char *candidate, int search, int insensitive)
{
   int where=0;
   int start = -1;
   
   if (!search) {
      // parse to first '*'
      if (*expr != '*')
         start = 0;
      while (*expr != '*') {
         if (!*expr)
            return *candidate == 0 ? 0 : -1;
         if (*expr == '?') {
            if (!*candidate) return -1;
         } else {
            if (insensitive) {
               if (tolower(*candidate) != tolower(*expr))
                  return -1;
            } else 
               if (*candidate != *expr)
                  return -1;
         }
         ++candidate, ++expr, ++where;
      }
   } else {
      // 0-length search string
      if (!*expr)
         return 0;
   }

   assert(search || *expr == '*');
   if (!search)
      ++expr;

   // implicit '*' at this point
      
   while (*expr) {
      int o=0;
      // combine redundant * characters
      while (expr[0] == '*') ++expr;

      // ok, at this point, expr[-1] == '*',
      // and expr[0] != '*'

      if (!expr[0]) return start >= 0 ? start : 0;

      // now find next '*'
      o = 0;
      while (expr[o] != '*') {
         if (expr[o] == 0)
            break;
         ++o;
      }
      // if no '*', scan to end, then match at end
      if (expr[o] == 0 && !search) {
         int z;
         for (z=0; z < o; ++z)
            if (candidate[z] == 0)
               return -1;
         while (candidate[z])
            ++z;
         // ok, now check if they match
         if (stb__match_qstring(candidate+z-o, expr, o, insensitive))
            return start >= 0 ? start : 0;
         return -1; 
      } else {
         // if yes '*', then do stb__find_qmatch on the intervening chars
         int n = stb__find_qstring(candidate, expr, o, insensitive);
         if (n < 0)
            return -1;
         if (start < 0)
            start = where + n;
         expr += o;
         candidate += n+o;
      }

      if (*expr == 0) {
         assert(search);
         return start;
      }

      assert(*expr == '*');
      ++expr;
   }

   return start >= 0 ? start : 0;
}